

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O3

void utest_register_arguments_parse_0(void)

{
  size_t sVar1;
  char *pcVar2;
  utest_test_state_s *puVar3;
  
  sVar1 = utest_state.tests_length;
  utest_state.tests_length = utest_state.tests_length + 1;
  pcVar2 = (char *)malloc(0x12);
  puVar3 = (utest_test_state_s *)realloc(utest_state.tests,sVar1 * 0x18 + 0x18);
  utest_state.tests = puVar3;
  puVar3[sVar1].func = utest_arguments_parse_0;
  puVar3[sVar1].name = pcVar2;
  builtin_strncpy(pcVar2,"arguments.parse_0",0x12);
  return;
}

Assistant:

UTEST(arguments, parse_0) {
    Arguments arguments;

    const char* args[] = {
        "liveglsl",
        "--input",
        "shader.frag",
        "--width",
        "300",
        "--height",
        "200"
    };

    T(ArgumentsParse(ARRAY_LENGTH(args), args, arguments));
    TSTR(arguments.Input.c_str(), "shader.frag");
    T(arguments.Width == 300);
    T(arguments.Height == 200);
}